

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# droptxx.cpp
# Opt level: O2

void __thiscall dropt::context::context(context *this,dropt_option *options)

{
  dropt_context *pdVar1;
  undefined8 *puVar2;
  
  pdVar1 = (dropt_context *)dropt_new_context(options);
  (this->super_context_ref).mContext = pdVar1;
  if (pdVar1 != (dropt_context *)0x0) {
    return;
  }
  puVar2 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar2 = dropt_handle_string;
  __cxa_throw(puVar2,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
}

Assistant:

context::context(const dropt_option* options)
: context_ref(dropt_new_context(options))
{
    if (mContext == NULL) { throw std::bad_alloc(); }
}